

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSTimeminutes.c
# Opt level: O0

int FANSTimeminutes_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  undefined8 in_RCX;
  code *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  long value;
  int local_4;
  
  if (in_RSI == (long *)0x0) {
    if (in_RDX != (code *)0x0) {
      (*in_RDX)(in_RCX,in_RDI,0,"%s: value not given (%s:%d)",*in_RDI,
                "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSTimeminutes.c"
                ,0x12);
    }
    local_4 = -1;
  }
  else if ((*in_RSI < 0) || (0x3b < *in_RSI)) {
    if (in_RDX != (code *)0x0) {
      (*in_RDX)(in_RCX,in_RDI,in_RSI,"%s: constraint failed (%s:%d)",*in_RDI,
                "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSTimeminutes.c"
                ,0x1e);
    }
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
FANSTimeminutes_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	long value;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	value = *(const long *)sptr;
	
	if((value >= 0 && value <= 59)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}